

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O0

bool S2::ApproxEquals(S2Point *a,S2Point *b,S1Angle max_error)

{
  BasicVector<Vector3,_double,_3UL> *this;
  bool bVar1;
  ostream *poVar2;
  S1Angle local_a8;
  byte local_99;
  S2LogMessage local_98;
  S2LogMessageVoidify local_81;
  Vector3<double> local_80;
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  Vector3<double> local_38;
  BasicVector<Vector3,_double,_3UL> *local_20;
  S2Point *b_local;
  S2Point *a_local;
  S1Angle max_error_local;
  
  local_20 = (BasicVector<Vector3,_double,_3UL> *)b;
  b_local = a;
  a_local = (S2Point *)max_error.radians_;
  Vector3<double>::Vector3(&local_38);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)a,&local_38);
  local_51 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x26,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar2 = S2LogMessage::stream(&local_50);
    poVar2 = std::operator<<(poVar2,"Check failed: (a) != (S2Point()) ");
    S2LogMessageVoidify::operator&(&local_39,poVar2);
  }
  this = local_20;
  if ((local_51 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  Vector3<double>::Vector3(&local_80);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=(this,&local_80)
  ;
  local_99 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x27,kFatal,(ostream *)&std::cerr);
    local_99 = 1;
    poVar2 = S2LogMessage::stream(&local_98);
    poVar2 = std::operator<<(poVar2,"Check failed: (b) != (S2Point()) ");
    S2LogMessageVoidify::operator&(&local_81,poVar2);
  }
  if ((local_99 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_98);
  }
  S1Angle::S1Angle(&local_a8,b_local,(S2Point *)local_20);
  bVar1 = operator<=(local_a8,(S1Angle)a_local);
  return bVar1;
}

Assistant:

bool ApproxEquals(const S2Point& a, const S2Point& b, S1Angle max_error) {
  S2_DCHECK_NE(a, S2Point());
  S2_DCHECK_NE(b, S2Point());
  return S1Angle(a, b) <= max_error;
}